

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall JUnitTestOutputTestRunner::runPreviousTest(JUnitTestOutputTestRunner *this)

{
  uint local_14;
  uint i;
  JUnitTestOutputTestRunner *this_local;
  
  if (this->currentTest_ != (UtestShell *)0x0) {
    if ((this->firstTestInGroup_ & 1U) != 0) {
      TestResult::currentGroupStarted(&this->result_,this->currentTest_);
      this->firstTestInGroup_ = false;
    }
    TestResult::currentTestStarted(&this->result_,this->currentTest_);
    millisTime = this->timeTheTestTakes_ + millisTime;
    for (local_14 = 0; local_14 < this->numberOfChecksInTest_; local_14 = local_14 + 1) {
      TestResult::countCheck(&this->result_);
    }
    this->numberOfChecksInTest_ = 0;
    if (this->testFailure_ != (TestFailure *)0x0) {
      TestResult::addFailure(&this->result_,this->testFailure_);
      if (this->testFailure_ != (TestFailure *)0x0) {
        (*this->testFailure_->_vptr_TestFailure[1])();
      }
      this->testFailure_ = (TestFailure *)0x0;
    }
    TestResult::currentTestEnded(&this->result_,this->currentTest_);
  }
  return;
}

Assistant:

void runPreviousTest()
    {
        if (currentTest_ == NULLPTR) return;

        if (firstTestInGroup_) {
            result_.currentGroupStarted(currentTest_);
            firstTestInGroup_ = false;
        }
        result_.currentTestStarted(currentTest_);

        millisTime += timeTheTestTakes_;
        for(unsigned int i = 0; i < numberOfChecksInTest_; i++) {
            result_.countCheck();
        }
        numberOfChecksInTest_ = 0;

        if (testFailure_) {
            result_.addFailure(*testFailure_);
            delete testFailure_;
            testFailure_ = NULLPTR;
        }

        result_.currentTestEnded(currentTest_);
    }